

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

void __thiscall
front::irGenerator::irGenerator::ir_declare_value
          (irGenerator *this,string *name,SymbolKind kind,int id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *inits,localArrayInitType initType,
          int len)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *this_00;
  pointer pbVar1;
  size_t __n;
  pointer pcVar2;
  string name_00;
  string name_01;
  string name_02;
  ulong uVar3;
  undefined8 uVar4;
  int iVar5;
  long *plVar6;
  mapped_type *pmVar7;
  PtrTy *pPVar8;
  mapped_type *pmVar9;
  uint extraout_var;
  uint extraout_var_00;
  uint extraout_var_01;
  ulong *puVar10;
  uint32_t id_00;
  uint32_t id_01;
  uint32_t id_02;
  void *__storage;
  undefined1 auVar11 [8];
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar12;
  long lVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  Variable variable_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> varNameRef;
  string varName;
  RightVal size;
  Variable variable;
  RightVal value;
  undefined8 in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffb7c;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  undefined1 local_468;
  byte local_460;
  undefined4 local_45c;
  uint uStack_458;
  uint uStack_454;
  int local_44c;
  undefined1 local_448 [8];
  undefined1 auStack_440 [32];
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  value_type local_3c8;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  byte local_388;
  PtrTy *local_380;
  Variable local_378;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  byte local_338;
  _func_int **local_328;
  string local_320;
  string local_300;
  string local_2e0;
  SharedTyPtr local_2c0;
  SharedTyPtr local_2b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a0;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  SharedTyPtr local_208;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  byte local_110;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  byte local_e8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  byte local_c0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  byte local_98;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  pbVar1 = (this->_funcStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = pbVar1[-1]._M_string_length;
  local_44c = id;
  if ((__n == (this->_GlobalInitFuncName)._M_string_length) &&
     ((__n == 0 ||
      (iVar5 = bcmp(pbVar1[-1]._M_dataplus._M_p,(this->_GlobalInitFuncName)._M_dataplus._M_p,__n),
      iVar5 == 0)))) {
    uVar3 = (ulong)auStack_440._0_8_ >> 0x20;
    auStack_440._0_8_ = uVar3 << 0x20;
    local_420._M_first._M_storage._0_1_ = 0;
    local_448 = (undefined1  [8])&PTR_display_001f0778;
    local_420._12_4_ = local_420._12_4_ & 0xffffff00;
    if (len == 0) {
      uStack_454 = uStack_454 & 0xffffff00;
      auStack_440._0_8_ = uVar3 << 0x20;
      local_448 = (undefined1  [8])&PTR_display_001f0778;
      local_45c = 0;
      local_460 = '\0';
      in_stack_fffffffffffffb80 = 0;
      uVar15 = 0;
      uVar14 = 0x1f0778;
      local_420._M_first._M_storage._0_1_ = 0;
      local_420._12_4_ = uStack_454;
      local_420._4_8_ = (ulong)uStack_458 << 0x20;
      std::__detail::__variant::
      __gen_vtable_impl<std::__detail::__variant::_Multi_array<void_(*)((lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::integer_sequence<unsigned_long,_0UL>_>
      ::__visit_invoke((anon_class_1_0_00000001 *)&local_3a8._M_first,
                       (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffb80);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2a0,inits);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xfffffffffffffb80,
                 &local_2a0);
      local_460 = 1;
      uVar14 = 0x1f0778;
      uVar15 = 0;
      local_45c = 0;
      uStack_458 = 0;
      uStack_454 = 0;
      local_3a8._0_8_ =
           (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)auStack_440;
      std::operator=(&local_3a8,
                     (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xfffffffffffffb80,&local_358);
      local_420._4_8_ = CONCAT44(uStack_458,local_45c);
      local_420._12_4_ = uStack_454;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_460]._M_data)
                ((anon_class_1_0_00000001 *)&local_3a8._M_first,
                 (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb80);
      local_460 = 0xff;
      if (local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    pcVar2 = (name->_M_dataplus)._M_p;
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_150,pcVar2,pcVar2 + name->_M_string_length);
    name_01._M_string_length = in_stack_fffffffffffffb70;
    name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68;
    name_01.field_2._M_allocated_capacity._0_4_ = uVar14;
    name_01.field_2._M_allocated_capacity._4_4_ = uVar15;
    name_01.field_2._8_4_ = in_stack_fffffffffffffb80;
    name_01.field_2._12_4_ = in_stack_fffffffffffffb84;
    getVarName((string *)&stack0xfffffffffffffb78,this,name_01,id_01);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
             ::operator[](&(this->_package).global_values,(key_type *)&stack0xfffffffffffffb78);
    local_3a8._0_8_ = &pmVar7->field_0x8;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)local_420._M_first._M_storage._0_1_]._M_data)
              ((anon_class_8_1_8991fb9c_conflict2 *)&local_3a8._M_first,
               (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)auStack_440);
    *(undefined4 *)
     &(pmVar7->len).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = local_420._12_4_;
    pmVar7->ty = local_420._4_4_;
    (pmVar7->len).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
    ._M_payload = (_Storage<int,_true>)local_420._8_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uVar15,uVar14) != &local_478) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uVar15,uVar14),(ulong)(local_478._M_allocated_capacity + 1));
    }
    if (local_150[0] != local_140) {
      operator_delete(local_150[0],local_140[0] + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)local_420._M_first._M_storage._0_1_]._M_data)
              ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb78,
               (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)auStack_440);
    return;
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  local_3c8._M_string_length = 0;
  local_3c8.field_2._M_local_buf[0] = '\0';
  if (kind == Ptr) {
    pPVar8 = (PtrTy *)operator_new(0x18);
    local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(8);
    ((Displayable *)
    &((local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_Displayable)._vptr_Displayable)->_vptr_Displayable = (_func_int **)&PTR_display_001efd88;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              (&local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(IntTy *)local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    mir::types::PtrTy::PtrTy(pPVar8,&local_2c0);
    local_448 = (undefined1  [8])pPVar8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_440,pPVar8);
    auVar11 = local_448;
    local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_2c0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_440._0_8_;
  }
  else if (kind == Array) {
    if (initType - Small < 2) {
      pcVar2 = (name->_M_dataplus)._M_p;
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pcVar2,pcVar2 + name->_M_string_length);
      name_00._M_string_length = in_stack_fffffffffffffb70;
      name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68;
      name_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffb78;
      name_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb7c;
      name_00.field_2._8_4_ = in_stack_fffffffffffffb80;
      name_00.field_2._12_4_ = in_stack_fffffffffffffb84;
      getVarName((string *)&stack0xfffffffffffffb78,this,name_00,id_00);
      plVar6 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffb78);
      local_448 = (undefined1  [8])(auStack_440 + 8);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        auStack_440._8_8_ = *puVar10;
        auStack_440._16_8_ = plVar6[3];
      }
      else {
        auStack_440._8_8_ = *puVar10;
        local_448 = (undefined1  [8])*plVar6;
      }
      auStack_440._0_8_ = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78) != &local_478) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                        (ulong)(local_478._M_allocated_capacity + 1));
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      mir::types::new_int_ty();
      local_208.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_358._0_8_;
      local_208.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_;
      local_358._0_8_ = 0;
      local_358._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      mir::types::new_array_ty((types *)&local_3a8._M_first,&local_208,len);
      local_478._M_allocated_capacity = local_3a8._8_8_;
      uVar4 = local_3a8._0_8_;
      local_3a8._0_8_ =
           (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
      local_3a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      in_stack_fffffffffffffb80 = (undefined4)uVar4;
      in_stack_fffffffffffffb84 = (undefined4)((ulong)uVar4 >> 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._M_allocated_capacity ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_478._8_2_ = 1;
        local_478._M_local_buf[10] = '\0';
        local_478._12_4_ = 0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_478._M_allocated_capacity + 8) =
               *(_Atomic_word *)(local_478._M_allocated_capacity + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_478._M_allocated_capacity + 8) =
               *(_Atomic_word *)(local_478._M_allocated_capacity + 8) + 1;
        }
        local_478._8_2_ = 1;
        local_478._M_local_buf[10] = '\0';
        local_478._12_4_ = 0;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._M_allocated_capacity);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
      }
      if (local_208.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_);
      }
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,local_448,(pointer)(auStack_440._0_8_ + (long)local_448));
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
               ::operator[](&this->_funcNameToFuncData,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
      insertLocalValue(this,&local_228,pmVar9->_nowLocalValueId,(Variable *)&stack0xfffffffffffffb78
                      );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
               ::operator[](&this->_funcNameToFuncData,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
      pmVar9->_nowLocalValueId = pmVar9->_nowLocalValueId + 1;
      in_stack_fffffffffffffb78 = 0x1eff98;
      in_stack_fffffffffffffb7c = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._M_allocated_capacity);
      }
      if (local_448 != (undefined1  [8])(auStack_440 + 8)) {
        operator_delete((void *)local_448,auStack_440._8_8_ + 1);
      }
    }
    pPVar8 = (PtrTy *)operator_new(0x18);
    local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(8);
    ((Displayable *)
    &((local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_Displayable)._vptr_Displayable)->_vptr_Displayable = (_func_int **)&PTR_display_001efd88;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              (&local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(IntTy *)local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    mir::types::PtrTy::PtrTy(pPVar8,&local_2b0);
    local_448 = (undefined1  [8])pPVar8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_440,pPVar8);
    auVar11 = local_448;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_440._0_8_;
  }
  else {
    if (kind != INT) {
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      auVar11 = (undefined1  [8])0x0;
      goto LAB_00186861;
    }
    local_448 = (undefined1  [8])operator_new(8);
    (((PtrTy *)local_448)->super_Ty).super_Displayable._vptr_Displayable =
         (_func_int **)&PTR_display_001efd88;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_440,(IntTy *)local_448);
    local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auVar11 = local_448;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_440._0_8_;
  }
  auStack_440._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_448 = (undefined1  [8])0x0;
  if (local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
LAB_00186861:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_378.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
  local_328 = (_func_int **)&PTR_display_001eff98;
  local_380 = (PtrTy *)auVar11;
  local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar11;
  local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_01;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_378.is_memory_var = false;
    local_378.is_temp_var = false;
    local_378.is_phi_var = false;
    local_378.priority = 0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    local_378.is_memory_var = false;
    local_378.is_temp_var = false;
    local_378.is_phi_var = false;
    local_378.priority = 0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_190,pcVar2,pcVar2 + name->_M_string_length);
  name_02._M_string_length = (size_type)this_01;
  name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68;
  name_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffb78;
  name_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb7c;
  name_02.field_2._8_4_ = in_stack_fffffffffffffb80;
  name_02.field_2._12_4_ = in_stack_fffffffffffffb84;
  getVarName((string *)local_448,this,name_02,id_02);
  std::__cxx11::string::operator=((string *)&local_3c8,(string *)local_448);
  puVar10 = (ulong *)(auStack_440 + 8);
  if (local_448 != (undefined1  [8])puVar10) {
    operator_delete((void *)local_448,auStack_440._8_8_ + 1);
  }
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_3c8._M_dataplus._M_p,
             local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
  this_00 = &this->_funcNameToFuncData;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  insertLocalValue(this,&local_248,pmVar9->_nowLocalValueId,&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar9->_nowLocalValueId = pmVar9->_nowLocalValueId + 1;
  if (kind == Array) {
    switch(initType) {
    case Small:
      local_b8._0_8_ = (long)&local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      local_98 = 1;
      local_448 = (undefined1  [8])puVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_448,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      std::__cxx11::string::append(local_448);
      local_e0._0_8_ = (long)&local_e0 + 0x10;
      if (local_448 == (undefined1  [8])puVar10) {
        local_e0._24_8_ = auStack_440._16_8_;
      }
      else {
        local_e0._0_8_ = local_448;
      }
      local_e0._16_8_ = auStack_440._8_8_;
      local_e0._8_8_ = auStack_440._0_8_;
      auStack_440._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      auStack_440._8_8_ = auStack_440._8_8_ & 0xffffffffffffff00;
      local_c0 = 1;
      local_448 = (undefined1  [8])puVar10;
      ir_ref(this,(LeftVal *)&local_b8._M_first,(LeftVal *)&local_e0._M_first,true);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_c0]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb78,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0._M_first);
      local_c0 = 0xff;
      if (local_448 != (undefined1  [8])puVar10) {
        operator_delete((void *)local_448,auStack_440._8_8_ + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_98]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8._M_first);
      local_98 = 0xff;
      break;
    case SmallInit:
      local_108._0_8_ = (long)&local_108 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      local_e8 = 1;
      local_448 = (undefined1  [8])puVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_448,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      std::__cxx11::string::append(local_448);
      pPVar8 = local_380;
      local_130._0_8_ = (long)&local_130 + 0x10;
      if (local_448 == (undefined1  [8])puVar10) {
        local_130._24_8_ = auStack_440._16_8_;
      }
      else {
        local_130._0_8_ = local_448;
      }
      local_130._16_8_ = auStack_440._8_8_;
      local_130._8_8_ = auStack_440._0_8_;
      auStack_440._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      auStack_440._8_8_ = auStack_440._8_8_ & 0xffffffffffffff00;
      local_110 = 1;
      local_448 = (undefined1  [8])puVar10;
      ir_ref(this,(LeftVal *)&local_108._M_first,(LeftVal *)&local_130._M_first,true);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_110]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb78,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130._M_first);
      local_110 = 0xff;
      if (local_448 != (undefined1  [8])puVar10) {
        operator_delete((void *)local_448,auStack_440._8_8_ + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_e8]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108._M_first);
      local_e8 = 0xff;
      local_468 = 0;
      local_3a8._0_8_ = local_3a8._0_8_ & 0xffffffff00000000;
      local_388 = 0;
      iVar5 = (*(pPVar8->super_Ty).super_Displayable._vptr_Displayable[3])(pPVar8);
      if ((extraout_var_01 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_388]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      local_3a8._M_first._M_storage = (_Uninitialized<int,_true>)(iVar5 * len);
      local_388 = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_468]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb78);
      local_468 = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb78);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      local_2e0._M_string_length = 0;
      local_2e0.field_2._M_local_buf[0] = '\0';
      local_1b0.field_2._M_allocated_capacity._0_4_ = 0x736d656d;
      local_1b0.field_2._M_allocated_capacity._4_2_ = 0x7465;
      local_1b0._M_string_length = 6;
      local_1b0.field_2._M_local_buf[6] = '\0';
      local_448 = (undefined1  [8])puVar10;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_448,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      auStack_440[0x18] = 2;
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_420._M_first,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xfffffffffffffb78);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3f8,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3a8._M_first);
      __l_02._M_len = 3;
      __l_02._M_array = (iterator)local_448;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_48,__l_02,(allocator_type *)&local_358._M_first);
      ir_function_call(this,&local_2e0,VID,&local_1b0,&local_48,true);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_48);
      lVar13 = -0x78;
      pvVar12 = &local_3f8;
      do {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [(pvVar12->
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)&local_358._M_first,pvVar12);
        (pvVar12->
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        pvVar12 = pvVar12 + -1;
        lVar13 = lVar13 + 0x28;
      } while (lVar13 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,
                        CONCAT17(local_1b0.field_2._M_local_buf[7],
                                 CONCAT16(local_1b0.field_2._M_local_buf[6],
                                          CONCAT24(local_1b0.field_2._M_allocated_capacity._4_2_,
                                                   local_1b0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                                 local_2e0.field_2._M_local_buf[0]) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_388]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_468]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb78);
      break;
    case BigNoInit:
      local_448 = (undefined1  [8])((ulong)local_448 & 0xffffffff00000000);
      auStack_440[0x18] = 0;
      iVar5 = (*(local_380->super_Ty).super_Displayable._vptr_Displayable[3])();
      if ((extraout_var & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)auStack_440[0x18]]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb78,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_448);
      local_448._0_4_ = iVar5 * len;
      auStack_440[0x18] = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_448);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      local_1f0.field_2._M_allocated_capacity._0_4_ = 0x6c6c616d;
      local_1f0.field_2._M_allocated_capacity._4_2_ = 0x636f;
      local_1f0._M_string_length = 6;
      local_1f0.field_2._M_local_buf[6] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xfffffffffffffb78,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_448);
      __l._M_len = 1;
      __l._M_array = (iterator)&stack0xfffffffffffffb78;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_90,__l,(allocator_type *)&local_3a8._M_first);
      ir_function_call(this,&local_288,Ptr,&local_1f0,&local_90,true);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_90);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_468]._M_data)
                ((anon_class_1_0_00000001 *)&local_3a8._M_first,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT17(local_1f0.field_2._M_local_buf[7],
                                 CONCAT16(local_1f0.field_2._M_local_buf[6],
                                          CONCAT24(local_1f0.field_2._M_allocated_capacity._4_2_,
                                                   local_1f0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
               ::operator[](this_00,(this->_funcStack).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pmVar9->_freeList,&local_3c8);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)auStack_440[0x18]]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb78,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_448);
      break;
    case BigInit:
      local_468 = 0;
      local_3a8._0_8_ = local_3a8._0_8_ & 0xffffffff00000000;
      local_388 = 0;
      local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
      local_338 = 0;
      iVar5 = (*(local_380->super_Ty).super_Displayable._vptr_Displayable[3])();
      if ((extraout_var_00 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_388]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      local_3a8._M_first._M_storage = (_Uninitialized<int,_true>)(iVar5 * len);
      local_388 = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      local_1d0.field_2._M_allocated_capacity._0_4_ = 0x6c6c616d;
      local_1d0.field_2._M_allocated_capacity._4_2_ = 0x636f;
      local_1d0._M_string_length = 6;
      local_1d0.field_2._M_local_buf[6] = '\0';
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_448,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3a8._M_first);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_448;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_60,__l_00,(allocator_type *)&stack0xfffffffffffffb6f);
      ir_function_call(this,&local_268,Ptr,&local_1d0,&local_60,true);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_60);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)auStack_440[0x18]]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffb6f,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT17(local_1d0.field_2._M_local_buf[7],
                                 CONCAT16(local_1d0.field_2._M_local_buf[6],
                                          CONCAT24(local_1d0.field_2._M_allocated_capacity._4_2_,
                                                   local_1d0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_338]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358._M_first);
      local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
      local_338 = 0;
      std::get<0ul,int,int,std::__cxx11::string>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358._M_first);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      local_300._M_string_length = 0;
      local_300.field_2._M_local_buf[0] = '\0';
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_320.field_2._M_allocated_capacity._0_4_ = 0x736d656d;
      local_320.field_2._M_allocated_capacity._4_2_ = 0x7465;
      local_320._M_string_length = 6;
      local_320.field_2._M_local_buf[6] = '\0';
      local_448 = (undefined1  [8])puVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_448,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      auStack_440[0x18] = 2;
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_420._M_first,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_358._M_first);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3f8,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_3a8._M_first);
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)local_448;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_78,__l_01,(allocator_type *)&stack0xfffffffffffffb6f);
      ir_function_call(this,&local_300,VID,&local_320,&local_78,true);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_78);
      lVar13 = -0x78;
      pvVar12 = &local_3f8;
      do {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [(pvVar12->
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)&stack0xfffffffffffffb6f,pvVar12);
        (pvVar12->
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        pvVar12 = pvVar12 + -1;
        lVar13 = lVar13 + 0x28;
      } while (lVar13 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 CONCAT16(local_320.field_2._M_local_buf[6],
                                          CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                                   local_320.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,
                                 local_300.field_2._M_local_buf[0]) + 1);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
               ::operator[](this_00,(this->_funcStack).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pmVar9->_freeList,&local_3c8);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_338]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_358._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_388]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3a8._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_468]._M_data)
                ((anon_class_1_0_00000001 *)local_448,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffb78);
    }
  }
  local_378.super_Displayable._vptr_Displayable = local_328;
  if (local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,
                    CONCAT71(local_3c8.field_2._M_allocated_capacity._1_7_,
                             local_3c8.field_2._M_local_buf[0]) + 1);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void irGenerator::ir_declare_value(string name, symbol::SymbolKind kind, int id,
                                   std::vector<uint32_t> inits,
                                   localArrayInitType initType, int len) {
  if (_funcStack.back() == _GlobalInitFuncName) {
    GlobalValue globalValue;
    if (len == 0) {
      globalValue = GlobalValue(0);
    } else {
      globalValue = GlobalValue(inits);
    }
    _package.global_values[getVarName(name, id)] = globalValue;
  } else {
    SharedTyPtr ty;
    bool is_memory;
    string varName;

    switch (kind) {
      case front::symbol::SymbolKind::INT:
        ty = SharedTyPtr(new IntTy());
        is_memory = false;
        break;
      case front::symbol::SymbolKind::Array:
        if (initType == localArrayInitType::Small ||
            initType == localArrayInitType::SmallInit) {
          auto varNameRef = getVarName(name, id) + "_$array";

          Variable variable(
              mir::types::new_array_ty(mir::types::new_int_ty(), len), true,
              false, false);
          insertLocalValue(
              varNameRef,
              _funcNameToFuncData[_funcStack.back()]._nowLocalValueId,
              variable);
          _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++;
        }
        ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
        is_memory = false;
        break;
      case front::symbol::SymbolKind::Ptr:
        ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
        is_memory = false;
        break;
      default:
        break;
    }
    Variable variable(ty, is_memory, false);
    varName = getVarName(name, id);

    insertLocalValue(varName,
                     _funcNameToFuncData[_funcStack.back()]._nowLocalValueId,
                     variable);
    _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++;

    if (kind == symbol::SymbolKind::Array) {
      switch (initType) {
        case localArrayInitType::Small: {
          ir_ref(varName, varName + "_$array", true);
          break;
        }
        case localArrayInitType::SmallInit: {
          ir_ref(varName, varName + "_$array", true);
          RightVal value;
          RightVal size;
          size.emplace<0>(len * ty->size().value());
          value.emplace<0>(0);
          ir_function_call("", symbol::SymbolKind::VID, "memset",
                           {varName, value, size}, true);
          break;
        }
        case localArrayInitType::BigInit: {
          RightVal nitems;
          RightVal size;
          RightVal value;

          size.emplace<0>(len * ty->size().value());
          ir_function_call(varName, symbol::SymbolKind::Ptr, "malloc", {size},
                           true);
          value.emplace<0>(0);
          ir_function_call("", symbol::SymbolKind::VID, "memset",
                           {varName, value, size}, true);
          _funcNameToFuncData[_funcStack.back()]._freeList.push_back(varName);
          break;
        }
        case localArrayInitType::BigNoInit: {
          RightVal right;
          right.emplace<0>(len * ty->size().value());
          ir_function_call(varName, symbol::SymbolKind::Ptr, "malloc", {right},
                           true);
          _funcNameToFuncData[_funcStack.back()]._freeList.push_back(varName);
          break;
        }
        default:
          break;
      }
    }
  }
}